

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test::
~CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test
          (CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test
            ((CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test *)0x27f058);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_outparameter_nullptr)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(100000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  EXPECT_THROW(std::vector<Utxo> ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, nullptr, &fee, &use_bnb), CfdException);
}